

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::product
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,
          vector<double,_std::allocator<double>_> *row)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  value_type_conflict1 local_20;
  
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (result,(long)this->num_row_,&local_20);
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (row->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      iVar9 = *piVar3;
      do {
        iVar2 = piVar3[lVar10 + 1];
        if (iVar9 < iVar2) {
          lVar8 = (long)iVar9;
          do {
            iVar9 = piVar4[lVar8];
            pdVar7[iVar9] = pdVar5[lVar10] * pdVar6[lVar8] + pdVar7[iVar9];
            lVar8 = lVar8 + 1;
          } while (iVar2 != lVar8);
        }
        lVar10 = lVar10 + 1;
        iVar9 = iVar2;
      } while (lVar10 != iVar1);
    }
  }
  else {
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (row->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (result->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      iVar9 = *piVar3;
      do {
        iVar2 = piVar3[lVar10 + 1];
        if (iVar9 < iVar2) {
          dVar11 = pdVar7[lVar10];
          lVar8 = (long)iVar9;
          do {
            dVar11 = dVar11 + pdVar5[piVar4[lVar8]] * pdVar6[lVar8];
            pdVar7[lVar10] = dVar11;
            lVar8 = lVar8 + 1;
          } while (iVar2 != lVar8);
        }
        lVar10 = lVar10 + 1;
        iVar9 = iVar2;
      } while (lVar10 != iVar1);
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::product(vector<double>& result,
                                const vector<double>& row) const {
  assert(this->formatOk());
  assert((int)row.size() >= this->num_col_);
  result.assign(this->num_row_, 0.0);
  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        result[this->index_[iEl]] += row[iCol] * this->value_[iEl];
    }
  } else {
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        result[iRow] += row[this->index_[iEl]] * this->value_[iEl];
    }
  }
}